

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_refcount.c
# Opt level: O1

void uo_refcount_dec(uo_refcount *refcount)

{
  atomic_uint_fast32_t *paVar1;
  long lVar2;
  long *plVar3;
  long *in_FS_OFFSET;
  
  LOCK();
  paVar1 = &refcount->count;
  *paVar1 = *paVar1 - 1;
  UNLOCK();
  if (*paVar1 == 0) {
    (*refcount->finalizer)(refcount->ptr);
    if (refcount[-1].finalizer != (_func_void_void_ptr *)0x0) {
      __assert_fail("!uo__linklist_is_linked(link)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/UoLeevi[P]libuo/uo_linklist/src/include/uo_linklist/uo_linklist.h"
                    ,0xa6,"void uo__linklist_link(uo_linklist *, uo_linklist *)");
    }
    lVar2 = *in_FS_OFFSET;
    plVar3 = (long *)in_FS_OFFSET[-1];
    refcount[-1].count = (atomic_uint_fast32_t)plVar3;
    *plVar3 = (long)&refcount[-1].finalizer;
    refcount[-1].finalizer = (_func_void_void_ptr *)(lVar2 + -0x10);
    in_FS_OFFSET[-1] = (long)&refcount[-1].finalizer;
  }
  return;
}

Assistant:

void uo_refcount_dec(
    uo_refcount *refcount)
{
    if (atomic_fetch_sub(&refcount->count, 1) == 1)
    {
        refcount->finalizer(refcount->ptr);
        uo_refcount_linkpool_return(uo_refcount_get_linklist(refcount));
    }
}